

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_tokenizer.cc
# Opt level: O1

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 uVar2;
  _Alloc_hider _Var3;
  char cVar4;
  char cVar5;
  int iVar6;
  uint uVar7;
  char *pcVar8;
  FileInputSource *this;
  BufferInputSource *pBVar9;
  long *plVar10;
  undefined8 extraout_RAX;
  ostream *poVar11;
  char *pcVar12;
  size_type *psVar13;
  int extraout_EDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var14;
  int iVar15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *unaff_R13;
  undefined4 uVar16;
  Pipeline *pPVar17;
  long lVar18;
  bool bVar19;
  bool bVar20;
  QPDF qpdf;
  Pl_Buffer plb;
  shared_ptr<Buffer> content_data;
  shared_ptr<Buffer> b;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  string local_198;
  ulong local_170;
  QPDF local_168 [12];
  undefined4 local_15c;
  undefined4 *local_158;
  undefined8 local_150;
  undefined4 local_148;
  undefined1 uStack_144;
  undefined1 uStack_143;
  undefined2 uStack_142;
  string local_138 [2];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_f0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_e8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_e0;
  shared_ptr<InputSource> local_d0;
  shared_ptr<InputSource> local_c0;
  shared_ptr<InputSource> local_b0;
  Pipeline *local_a0;
  Buffer *local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_90;
  long local_88;
  long local_80;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  string local_60 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  string local_40 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  
  QUtil::setLineBuf(_stdout);
  pcVar12 = *argv;
  pcVar8 = strrchr(pcVar12,0x2f);
  whoami = pcVar8 + 1;
  if (pcVar8 == (char *)0x0) {
    whoami = pcVar12;
  }
  uVar16 = 1;
  if (argc < 2) {
    local_170 = 0;
    p_Var14 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    iVar15 = 1;
    p_Var14 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_170 = 0;
    do {
      unaff_R13 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)argv[iVar15];
      if (*(char *)&unaff_R13->_vptr__Sp_counted_base == '-') {
        iVar6 = strcmp((char *)unaff_R13,"-maxlen");
        if (iVar6 == 0) {
          iVar15 = iVar15 + 1;
          if (argc <= iVar15) goto LAB_00105128;
          uVar7 = QUtil::string_to_uint(argv[iVar15]);
          local_170 = (ulong)uVar7;
        }
        else {
          iVar6 = strcmp((char *)unaff_R13,"-no-ignorable");
          if (iVar6 != 0) goto LAB_00105128;
          uVar16 = 0;
        }
      }
      else {
        bVar19 = p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        p_Var14 = unaff_R13;
        if (bVar19) goto LAB_00105128;
      }
      iVar15 = iVar15 + 1;
    } while (iVar15 < argc);
  }
  if (p_Var14 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_00105128:
    usage();
    QPDF::~QPDF(local_168);
    if (unaff_R13 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(unaff_R13);
    }
    if (extraout_EDX != 1) {
      _Unwind_Resume(extraout_RAX);
    }
    plVar10 = (long *)__cxa_begin_catch(extraout_RAX);
    poVar11 = std::operator<<((ostream *)&std::cerr,whoami);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,": exception: ",0xd);
    pcVar12 = (char *)(**(code **)(*plVar10 + 0x10))(plVar10);
    std::operator<<(poVar11,pcVar12);
    exit(2);
  }
  this = (FileInputSource *)operator_new(0xd8);
  FileInputSource::FileInputSource(this,(char *)p_Var14);
  local_138[0]._M_dataplus._M_p = (pointer)this;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<FileInputSource*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_138[0]._M_string_length,this);
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138[0]._M_string_length;
  local_b0.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_138[0]._M_dataplus._M_p;
  local_b0.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138[0]._M_string_length;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138[0]._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(_Atomic_word *)(local_138[0]._M_string_length + 8) =
           *(_Atomic_word *)(local_138[0]._M_string_length + 8) + 1;
      UNLOCK();
    }
    else {
      *(_Atomic_word *)(local_138[0]._M_string_length + 8) =
           *(_Atomic_word *)(local_138[0]._M_string_length + 8) + 1;
    }
  }
  local_138[0].field_2._M_allocated_capacity._0_4_ = 0x454c4946;
  local_138[0]._M_string_length = 4;
  local_138[0].field_2._M_local_buf[4] = '\0';
  local_15c = uVar16;
  local_138[0]._M_dataplus._M_p = (pointer)&local_138[0].field_2;
  dump_tokens(&local_b0,local_138,local_170,SUB41(uVar16,0),true,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138[0]._M_dataplus._M_p != &local_138[0].field_2) {
    operator_delete(local_138[0]._M_dataplus._M_p,
                    CONCAT26(local_138[0].field_2._M_allocated_capacity._6_2_,
                             CONCAT15(local_138[0].field_2._M_local_buf[5],
                                      CONCAT14(local_138[0].field_2._M_local_buf[4],
                                               (undefined4)
                                               local_138[0].field_2._M_allocated_capacity))) + 1);
  }
  if (local_b0.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b0.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  QPDF::QPDF(local_168);
  QPDF::processFile((char *)local_168,(char *)p_Var14);
  QPDFPageDocumentHelper::QPDFPageDocumentHelper((QPDFPageDocumentHelper *)local_138,local_168);
  QPDFPageDocumentHelper::getAllPages();
  QPDFPageDocumentHelper::~QPDFPageDocumentHelper((QPDFPageDocumentHelper *)local_138);
  local_a0 = (Pipeline *)local_1b8._8_8_;
  if (local_1b8._0_8_ != local_1b8._8_8_) {
    paVar1 = &local_198.field_2;
    iVar15 = 1;
    pPVar17 = (Pipeline *)local_1b8._0_8_;
    do {
      Pl_Buffer::Pl_Buffer((Pl_Buffer *)local_138,"buffer",(Pipeline *)0x0);
      QPDFPageObjectHelper::pipeContents(pPVar17);
      Pl_Buffer::getBufferSharedPointer();
      pBVar9 = (BufferInputSource *)operator_new(0xe8);
      local_198.field_2._M_allocated_capacity = 0x20746e65746e6f63;
      local_198._M_string_length = 0xc;
      local_198.field_2._8_5_ = 0x61746164;
      local_198._M_dataplus._M_p = (pointer)paVar1;
      BufferInputSource::BufferInputSource(pBVar9,(string *)&local_198,(Buffer *)local_f0,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != paVar1) {
        operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
      }
      local_198._M_dataplus._M_p = (pointer)pBVar9;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<BufferInputSource*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_198._M_string_length,pBVar9);
      _Var3._M_p = local_198._M_dataplus._M_p;
      local_f8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._M_string_length;
      local_198._M_dataplus._M_p = (pointer)0x0;
      local_198._M_string_length = 0;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._M_string_length);
      }
      this_00 = local_f8;
      local_c0.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)_Var3._M_p;
      local_c0.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           local_f8;
      if (local_f8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_f8->_M_use_count = local_f8->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_f8->_M_use_count = local_f8->_M_use_count + 1;
        }
      }
      QUtil::int_to_string_abi_cxx11_((longlong)&local_158,iVar15);
      plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_158,0,(char *)0x0,0x1070df);
      psVar13 = (size_type *)(plVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar13) {
        local_198.field_2._M_allocated_capacity = *psVar13;
        local_198.field_2._8_8_ = plVar10[3];
        local_198._M_dataplus._M_p = (pointer)paVar1;
      }
      else {
        local_198.field_2._M_allocated_capacity = *psVar13;
        local_198._M_dataplus._M_p = (pointer)*plVar10;
      }
      local_198._M_string_length = plVar10[1];
      *plVar10 = (long)psVar13;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      dump_tokens(&local_c0,&local_198,local_170,SUB41(local_15c,0),false,true);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != paVar1) {
        operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
      }
      if (local_158 != &local_148) {
        operator_delete(local_158,
                        CONCAT26(uStack_142,CONCAT15(uStack_143,CONCAT14(uStack_144,local_148))) + 1
                       );
      }
      if (local_c0.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_c0.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (local_e8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8);
      }
      Pl_Buffer::~Pl_Buffer((Pl_Buffer *)local_138);
      pPVar17 = pPVar17 + 0x38;
      iVar15 = iVar15 + 1;
    } while (pPVar17 != local_a0);
  }
  std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector
            ((vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> *)local_1b8);
  QPDF::getAllObjects();
  lVar18 = local_88;
  do {
    if (lVar18 == local_80) {
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector
                ((vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> *)&local_88);
      QPDF::~QPDF(local_168);
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      return 0;
    }
    cVar4 = QPDFObjectHandle::isStream();
    if (cVar4 == '\0') {
LAB_00104e09:
      bVar19 = false;
      bVar20 = false;
    }
    else {
      QPDFObjectHandle::getDict();
      local_138[0]._M_dataplus._M_p = (pointer)&local_138[0].field_2;
      local_138[0].field_2._M_local_buf[4] = 'e';
      local_138[0].field_2._M_allocated_capacity._0_4_ = 0x7079542f;
      local_138[0]._M_string_length = 5;
      local_138[0].field_2._M_local_buf[5] = '\0';
      QPDFObjectHandle::getKey(local_40);
      cVar5 = QPDFObjectHandle::isName();
      if (cVar5 == '\0') goto LAB_00104e09;
      QPDFObjectHandle::getDict();
      local_158 = &local_148;
      uStack_144 = 0x65;
      local_148 = 0x7079542f;
      local_150 = 5;
      uStack_143 = 0;
      QPDFObjectHandle::getKey(local_60);
      QPDFObjectHandle::getName_abi_cxx11_();
      iVar15 = std::__cxx11::string::compare((char *)&local_198);
      bVar20 = iVar15 == 0;
      bVar19 = true;
    }
    if (bVar19) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != &local_198.field_2) {
        operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
      }
      if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
      }
      if (local_158 != &local_148) {
        operator_delete(local_158,
                        CONCAT26(uStack_142,CONCAT15(uStack_143,CONCAT14(uStack_144,local_148))) + 1
                       );
      }
      if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
      }
    }
    if (cVar4 != '\0') {
      if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138[0]._M_dataplus._M_p != &local_138[0].field_2) {
        operator_delete(local_138[0]._M_dataplus._M_p,
                        CONCAT26(local_138[0].field_2._M_allocated_capacity._6_2_,
                                 CONCAT15(local_138[0].field_2._M_local_buf[5],
                                          CONCAT14(local_138[0].field_2._M_local_buf[4],
                                                   (undefined4)
                                                   local_138[0].field_2._M_allocated_capacity))) + 1
                       );
      }
      if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
      }
    }
    p_Var14 = this_00;
    if (bVar20) {
      QPDFObjectHandle::getStreamData((qpdf_stream_decode_level_e)&local_98);
      pBVar9 = (BufferInputSource *)operator_new(0xe8);
      local_1b8._0_8_ = local_1b8 + 0x10;
      local_f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x12;
      local_1b8._0_8_ = std::__cxx11::string::_M_create((ulong *)local_1b8,(ulong)&local_f0);
      local_1a8._M_allocated_capacity = (size_type)local_f0;
      builtin_strncpy((char *)local_1b8._0_8_,"object stream data",0x12);
      local_1b8._8_8_ = local_f0;
      *(char *)(local_1b8._0_8_ + (long)local_f0) = '\0';
      BufferInputSource::BufferInputSource(pBVar9,(string *)local_1b8,local_98,false);
      if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
        operator_delete((void *)local_1b8._0_8_,(ulong)(local_1a8._M_allocated_capacity + 1));
      }
      local_1b8._0_8_ = pBVar9;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<BufferInputSource*>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1b8 + 8),pBVar9);
      p_Var14 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_;
      uVar2 = local_1b8._0_8_;
      local_1b8._0_8_ = (pointer)0x0;
      local_1b8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1b8._8_8_);
      }
      local_d0.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)uVar2;
      local_d0.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           p_Var14;
      if (p_Var14 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(_Atomic_word *)((long)p_Var14 + 8) = *(_Atomic_word *)((long)p_Var14 + 8) + 1;
          UNLOCK();
        }
        else {
          *(_Atomic_word *)((long)p_Var14 + 8) = *(_Atomic_word *)((long)p_Var14 + 8) + 1;
        }
      }
      iVar15 = QPDFObjectHandle::getObjectID();
      QUtil::int_to_string_abi_cxx11_((longlong)&local_f0,iVar15);
      plVar10 = (long *)std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,0x107106);
      pPVar17 = (Pipeline *)(plVar10 + 2);
      if ((Pipeline *)*plVar10 == pPVar17) {
        local_1a8._M_allocated_capacity = *(undefined8 *)&pPVar17->field_0x0;
        local_1a8._8_8_ = plVar10[3];
        local_1b8._0_8_ = (Pipeline *)(local_1b8 + 0x10);
      }
      else {
        local_1a8._M_allocated_capacity = *(undefined8 *)&pPVar17->field_0x0;
        local_1b8._0_8_ = (Pipeline *)*plVar10;
      }
      local_1b8._8_8_ = plVar10[1];
      *plVar10 = (long)pPVar17;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      dump_tokens(&local_d0,(string *)local_1b8,local_170,SUB41(local_15c,0),false,false);
      if ((Pipeline *)local_1b8._0_8_ != (Pipeline *)(local_1b8 + 0x10)) {
        operator_delete((void *)local_1b8._0_8_,local_1a8._M_allocated_capacity + 1);
      }
      if (local_f0 != &local_e0) {
        operator_delete(local_f0,(long)local_e0._vptr__Sp_counted_base + 1);
      }
      if (local_d0.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_d0.super___shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90);
      }
    }
    lVar18 = lVar18 + 0x10;
    this_00 = p_Var14;
  } while( true );
}

Assistant:

int
main(int argc, char* argv[])
{
    QUtil::setLineBuf(stdout);
    if ((whoami = strrchr(argv[0], '/')) == nullptr) {
        whoami = argv[0];
    } else {
        ++whoami;
    }

    char const* filename = nullptr;
    size_t max_len = 0;
    bool include_ignorable = true;
    for (int i = 1; i < argc; ++i) {
        if (argv[i][0] == '-') {
            if (strcmp(argv[i], "-maxlen") == 0) {
                if (++i >= argc) {
                    usage();
                }
                max_len = QUtil::string_to_uint(argv[i]);
            } else if (strcmp(argv[i], "-no-ignorable") == 0) {
                include_ignorable = false;
            } else {
                usage();
            }
        } else if (filename) {
            usage();
        } else {
            filename = argv[i];
        }
    }
    if (filename == nullptr) {
        usage();
    }

    try {
        process(filename, include_ignorable, max_len);
    } catch (std::exception& e) {
        std::cerr << whoami << ": exception: " << e.what();
        exit(2);
    }
    return 0;
}